

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O0

bool TdokuMinimize(bool pencilmark,bool monotonic,char *puzzle)

{
  bool bVar1;
  char *in_stack_00000430;
  bool in_stack_0000043e;
  bool in_stack_0000043f;
  GeneratorDpllTriadSimd *in_stack_00000440;
  
  bVar1 = anon_unknown.dwarf_b455::GeneratorDpllTriadSimd::Minimize
                    (in_stack_00000440,in_stack_0000043f,in_stack_0000043e,in_stack_00000430);
  return bVar1;
}

Assistant:

bool TdokuMinimize(bool pencilmark, bool monotonic, char *puzzle) {
    return generator.Minimize(pencilmark, monotonic, puzzle);
}